

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteStandard<duckdb::string_t,unsigned_long,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastStrictOperator<duckdb::TryCast>>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  unsigned_long *puVar2;
  data_ptr_t pdVar3;
  unsigned_long *puVar4;
  string_t *psVar5;
  optional_idx sel_vector;
  unsigned_long uVar6;
  idx_t iVar7;
  Vector *vector;
  SelectionVector *sel;
  undefined7 in_register_00000089;
  void *dataptr_00;
  string_t input_00;
  optional_idx dict_size;
  string_t *local_70;
  ValidityMask local_68;
  
  dataptr_00 = (void *)CONCAT71(in_register_00000089,errors);
  VVar1 = input->vector_type;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    puVar2 = (unsigned_long *)result->data;
    psVar5 = (string_t *)input->data;
    FlatVector::VerifyFlatVector(input);
    FlatVector::VerifyFlatVector(result);
    ExecuteFlat<duckdb::string_t,unsigned_long,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastStrictOperator<duckdb::TryCast>>
              (psVar5,puVar2,count,&input->validity,&result->validity,dataptr,adds_nulls);
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      if ((((errors == CANNOT_ERROR) &&
           (dict_size = DictionaryVector::DictionarySize(input),
           dict_size.index != 0xffffffffffffffff)) &&
          (iVar7 = optional_idx::GetIndex(&dict_size), iVar7 * 2 <= count)) &&
         (vector = DictionaryVector::Child(input), vector->vector_type == FLAT_VECTOR)) {
        puVar2 = (unsigned_long *)result->data;
        psVar5 = (string_t *)vector->data;
        iVar7 = optional_idx::GetIndex(&dict_size);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        ExecuteFlat<duckdb::string_t,unsigned_long,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastStrictOperator<duckdb::TryCast>>
                  (psVar5,puVar2,iVar7,&vector->validity,&result->validity,dataptr,adds_nulls);
        sel = DictionaryVector::SelVector(input);
        iVar7 = optional_idx::GetIndex(&dict_size);
        Vector::Dictionary(result,result,iVar7,sel,count);
        return;
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      puVar2 = (unsigned_long *)result->data;
      pdVar3 = input->data;
      puVar4 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      input_00.value.pointer.ptr = (char *)&result->validity;
      input_00.value._0_8_ = *(undefined8 *)(pdVar3 + 8);
      uVar6 = VectorTryCastStrictOperator<duckdb::TryCast>::
              Operation<duckdb::string_t,unsigned_long>
                        (*(VectorTryCastStrictOperator<duckdb::TryCast> **)pdVar3,input_00,
                         (ValidityMask *)0x0,(idx_t)dataptr,dataptr_00);
      *puVar2 = uVar6;
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
    Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)&dict_size);
    Vector::SetVectorType(result,FLAT_VECTOR);
    sel_vector = dict_size;
    puVar2 = (unsigned_long *)result->data;
    FlatVector::VerifyFlatVector(result);
    ExecuteLoop<duckdb::string_t,unsigned_long,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastStrictOperator<duckdb::TryCast>>
              (local_70,puVar2,count,(SelectionVector *)sel_vector.index,&local_68,&result->validity
               ,dataptr,adds_nulls);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}